

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O2

void __thiscall
xs::ExecutionRequestHandler::processMessage
          (ExecutionRequestHandler *this,MessageType type,deUint8 *data,size_t dataSize)

{
  _Alloc_hider _Var1;
  ProtocolError *pPVar2;
  TestDriver *pTVar3;
  deUint64 dVar4;
  allocator<char> local_e1;
  HelloMessage msg;
  TestMessage msg_1;
  _Alloc_hider local_90;
  _Alloc_hider local_70;
  _Alloc_hider local_50 [4];
  
  if (type == MESSAGETYPE_STOP_EXECUTION) {
    SimpleMessage<112>::SimpleMessage((SimpleMessage<112> *)&msg_1,data,dataSize);
    puts("StopExecutionMessage");
    pTVar3 = getTestDriver(this);
    TestDriver::stopProcess(pTVar3);
  }
  else if (type == MESSAGETYPE_TEST) {
    TestMessage::TestMessage(&msg_1,data,dataSize);
    printf("TestMessage: \'%s\'\n",msg_1.test._M_dataplus._M_p);
    TestMessage::~TestMessage(&msg_1);
  }
  else if (type == MESSAGETYPE_KEEPALIVE) {
    SimpleMessage<102>::SimpleMessage((SimpleMessage<102> *)&msg_1,data,dataSize);
    puts("KeepAliveMessage");
    dVar4 = deGetMicroseconds();
    this->m_lastKeepAliveReceived = dVar4;
  }
  else if (type == MESSAGETYPE_EXECUTE_BINARY) {
    ExecuteBinaryMessage::ExecuteBinaryMessage((ExecuteBinaryMessage *)&msg_1,data,dataSize);
    _Var1 = msg_1.test._M_dataplus;
    std::__cxx11::string::substr((ulong)&msg,(ulong)local_50);
    printf("ExecuteBinaryMessage: \'%s\', \'%s\', \'%s\', \'%s\'\n",_Var1._M_p,local_90._M_p,
           local_70._M_p,msg.super_Message._vptr_Message);
    std::__cxx11::string::~string((string *)&msg);
    pTVar3 = getTestDriver(this);
    TestDriver::startProcess
              (pTVar3,msg_1.test._M_dataplus._M_p,local_90._M_p,local_70._M_p,local_50[0]._M_p);
    dVar4 = deGetMicroseconds();
    this->m_lastKeepAliveReceived = dVar4;
    ExecuteBinaryMessage::~ExecuteBinaryMessage((ExecuteBinaryMessage *)&msg_1);
  }
  else {
    if (type != MESSAGETYPE_HELLO) {
      pPVar2 = (ProtocolError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg_1,"Unsupported message",(allocator<char> *)&msg);
      ProtocolError::ProtocolError(pPVar2,(string *)&msg_1);
      __cxa_throw(pPVar2,&ProtocolError::typeinfo,std::runtime_error::~runtime_error);
    }
    HelloMessage::HelloMessage(&msg,data,dataSize);
    printf("HelloMessage: version = %d\n",(ulong)(uint)msg.super_Message._12_4_);
    if (msg.super_Message._12_4_ != 0x12) {
      pPVar2 = (ProtocolError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg_1,"Unsupported protocol version",&local_e1);
      ProtocolError::ProtocolError(pPVar2,(string *)&msg_1);
      __cxa_throw(pPVar2,&ProtocolError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void ExecutionRequestHandler::processMessage (MessageType type, const deUint8* data, size_t dataSize)
{
	switch (type)
	{
		case MESSAGETYPE_HELLO:
		{
			HelloMessage msg(data, dataSize);
			DBG_PRINT(("HelloMessage: version = %d\n", msg.version));
			if (msg.version != PROTOCOL_VERSION)
				throw ProtocolError("Unsupported protocol version");
			break;
		}

		case MESSAGETYPE_TEST:
		{
			TestMessage msg(data, dataSize);
			DBG_PRINT(("TestMessage: '%s'\n", msg.test.c_str()));
			break;
		}

		case MESSAGETYPE_KEEPALIVE:
		{
			KeepAliveMessage msg(data, dataSize);
			DBG_PRINT(("KeepAliveMessage\n"));
			keepAliveReceived();
			break;
		}

		case MESSAGETYPE_EXECUTE_BINARY:
		{
			ExecuteBinaryMessage msg(data, dataSize);
			DBG_PRINT(("ExecuteBinaryMessage: '%s', '%s', '%s', '%s'\n", msg.name.c_str(), msg.params.c_str(), msg.workDir.c_str(), msg.caseList.substr(0, 10).c_str()));
			getTestDriver()->startProcess(msg.name.c_str(), msg.params.c_str(), msg.workDir.c_str(), msg.caseList.c_str());
			keepAliveReceived(); // \todo [2011-10-11 pyry] Remove this once Candy is fixed.
			break;
		}

		case MESSAGETYPE_STOP_EXECUTION:
		{
			StopExecutionMessage msg(data, dataSize);
			DBG_PRINT(("StopExecutionMessage\n"));
			getTestDriver()->stopProcess();
			break;
		}

		default:
			throw ProtocolError("Unsupported message");
	}
}